

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

int __thiscall qpdf::BaseHandle::copy(BaseHandle *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var1;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  element_type *__p;
  qpdf_object_type_e qVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *args;
  variant_alternative_t<8UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *args_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Base_ptr p_Var6;
  runtime_error *this_00;
  code *pcVar7;
  undefined *puVar8;
  BaseHandle local_98;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_88;
  QPDFObject *local_70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  new_items;
  
  qVar4 = resolved_type_code((BaseHandle *)dst);
  local_70 = (QPDFObject *)this;
  switch(qVar4) {
  case ot_uninitialized:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              ((logic_error *)this_00,"QPDFObjectHandle: attempting to copy an uninitialized object"
              );
    goto LAB_0019771f;
  case ot_reserved:
    QPDFObject::create<QPDF_Reserved>();
    break;
  case ot_null:
    QPDFObject::create<QPDF_Null>();
    break;
  case ot_boolean:
    std::
    get<3ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
              (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 **)dst);
    QPDFObject::create<QPDF_Bool,bool&>((bool *)this);
    break;
  case ot_integer:
    std::
    get<4ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
              (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 **)dst);
    QPDFObject::create<QPDF_Integer,long_long&>((longlong *)this);
    break;
  case ot_real:
    std::
    get<5ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
              (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 **)dst);
    QPDFObject::create<QPDF_Real,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    break;
  case ot_string:
    std::
    get<6ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
              (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 **)dst);
    QPDFObject::create<QPDF_String,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    break;
  case ot_name:
    std::
    get<7ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
              (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 **)dst);
    QPDFObject::create<QPDF_Name,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    break;
  case ot_array:
    args_00 = std::
              get<8ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           **)dst);
    if ((char)src == '\0') {
      if ((args_00->sp)._M_t.
          super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
          super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
          super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl == (Sparse *)0x0) {
        new_items._M_t._M_impl._0_8_ = 0;
        new_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        new_items._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        new_items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::reserve
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&new_items,
                   (long)(args_00->elements).
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(args_00->elements).
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 4);
        p_Var2 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 (args_00->elements).
                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (p_Var5 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                      (args_00->elements).
                      super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                      _M_impl.super__Vector_impl_data._M_start; this = (BaseHandle *)local_70,
            p_Var5 != p_Var2; p_Var5 = p_Var5 + 1) {
          if ((p_Var5->_M_ptr == (element_type *)0x0) || ((p_Var5->_M_ptr->og).obj != 0)) {
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_88,p_Var5);
            bVar3 = false;
          }
          else {
            copy(&local_98,(EVP_PKEY_CTX *)p_Var5,(EVP_PKEY_CTX *)0x0);
            local_88._M_ptr =
                 local_98.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_88._M_refcount._M_pi =
                 local_98.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
            local_98.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_98.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            bVar3 = true;
          }
          std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
          emplace_back<QPDFObjectHandle_const>
                    ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)&new_items,
                     (QPDFObjectHandle *)&local_88);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
          if (bVar3) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_98.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
        }
        local_88._M_ptr = (element_type *)((ulong)local_88._M_ptr & 0xffffffffffffff00);
        QPDFObject::
        create<QPDF_Array,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>,bool>
                  (local_70,(vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                            &new_items,(bool *)&local_88);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&new_items);
      }
      else {
        new_items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        new_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        new_items._M_t._M_impl._0_8_ = 0;
        new_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        new_items._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        std::make_unique<QPDF_Array::Sparse>();
        __p = local_88._M_ptr;
        local_88._M_ptr = (element_type *)0x0;
        std::__uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::reset
                  ((__uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> *)
                   &new_items,(pointer)__p);
        std::unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>::~unique_ptr
                  ((unique_ptr<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_> *)
                   &local_88);
        _Var1._M_head_impl =
             (args_00->sp)._M_t.
             super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>.
             _M_t.
             super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
             super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
        *(int *)new_items._M_t._M_impl._0_8_ = (_Var1._M_head_impl)->size;
        for (p_Var6 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->elements + 0x18);
            p_Var6 != (_Rb_tree_node_base *)((long)&(_Var1._M_head_impl)->elements + 8U);
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          if ((p_Var6[1]._M_parent == (_Base_ptr)0x0) ||
             (*(int *)&p_Var6[1]._M_parent[2]._M_left == 0)) {
            copy(&local_98,(EVP_PKEY_CTX *)&p_Var6[1]._M_parent,(EVP_PKEY_CTX *)0x0);
            local_88._M_ptr =
                 local_98.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_88._M_refcount._M_pi =
                 local_98.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
            local_98.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_98.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            bVar3 = false;
          }
          else {
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_88,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&p_Var6[1]._M_parent)
            ;
            bVar3 = true;
          }
          p_Var5 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                   std::
                   map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                   ::operator[]((map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
                                 *)(new_items._M_t._M_impl._0_8_ + 8),(key_type *)(p_Var6 + 1));
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var5,&local_88);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
          if (!bVar3) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_98.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
        }
        QPDFObject::create<QPDF_Array,QPDF_Array>((QPDFObject *)this,(QPDF_Array *)&new_items);
        QPDF_Array::~QPDF_Array((QPDF_Array *)&new_items);
      }
    }
    else {
      QPDFObject::create<QPDF_Array,QPDF_Array_const&>((QPDFObject *)this,args_00);
    }
    break;
  case ot_dictionary:
    args = &std::
            get<9ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                      (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                         **)dst)->items;
    if ((char)src == '\0') {
      new_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &new_items._M_t._M_impl.super__Rb_tree_header._M_header;
      new_items._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (ulong)(uint)new_items._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
      new_items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      new_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      new_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           new_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (p_Var6 = (args->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          this = (BaseHandle *)local_70,
          (_Rb_tree_header *)p_Var6 != &(args->_M_t)._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        if ((*(long *)(p_Var6 + 2) == 0) || (*(int *)(*(long *)(p_Var6 + 2) + 0x50) == 0)) {
          copy(&local_98,(EVP_PKEY_CTX *)(p_Var6 + 2),(EVP_PKEY_CTX *)0x0);
          local_88._M_ptr =
               local_98.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_88._M_refcount._M_pi =
               local_98.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
          local_98.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_98.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          bVar3 = false;
        }
        else {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_88,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(p_Var6 + 2))
          ;
          bVar3 = true;
        }
        p_Var5 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                 ::operator[](&new_items,(key_type *)(p_Var6 + 1));
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var5,&local_88);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
        if (!bVar3) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_98.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
      QPDFObject::
      create<QPDF_Dictionary,std::map<std::__cxx11::string,QPDFObjectHandle,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>>&>
                (local_70,&new_items);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::~_Rb_tree(&new_items._M_t);
    }
    else {
      QPDFObject::
      create<QPDF_Dictionary,std::map<std::__cxx11::string,QPDFObjectHandle,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>>const&>
                ((QPDFObject *)this,args);
    }
    break;
  case ot_stream:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"stream objects cannot be cloned");
    puVar8 = &std::runtime_error::typeinfo;
    pcVar7 = std::runtime_error::~runtime_error;
    goto LAB_00197757;
  case ot_operator:
    std::
    get<11ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
              (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 **)dst);
    QPDFObject::create<QPDF_Operator,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    break;
  case ot_inlineimage:
    std::
    get<12ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
              (*(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 **)dst);
    QPDFObject::create<QPDF_InlineImage,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    break;
  case ot_unresolved:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              ((logic_error *)this_00,"QPDFObjectHandle: attempting to unparse a reserved object");
    goto LAB_0019771f;
  case ot_destroyed:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              ((logic_error *)this_00,
               "attempted to shallow copy QPDFObjectHandle from destroyed QPDF");
LAB_0019771f:
    puVar8 = &std::logic_error::typeinfo;
    pcVar7 = std::logic_error::~logic_error;
LAB_00197757:
    __cxa_throw(this_00,puVar8,pcVar7);
  case ot_reference:
    QPDF::getObject((QPDF *)&new_items,*(QPDFObjGen *)(*(long *)dst + 0x48));
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&new_items);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &new_items._M_t._M_impl.super__Rb_tree_header);
    break;
  default:
    (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  return (int)this;
}

Assistant:

std::shared_ptr<QPDFObject>
BaseHandle::copy(bool shallow) const
{
    switch (resolved_type_code()) {
    case ::ot_uninitialized:
        throw std::logic_error("QPDFObjectHandle: attempting to copy an uninitialized object");
        return {}; // does not return
    case ::ot_reserved:
        return QPDFObject::create<QPDF_Reserved>();
    case ::ot_null:
        return QPDFObject::create<QPDF_Null>();
    case ::ot_boolean:
        return QPDFObject::create<QPDF_Bool>(std::get<QPDF_Bool>(obj->value).val);
    case ::ot_integer:
        return QPDFObject::create<QPDF_Integer>(std::get<QPDF_Integer>(obj->value).val);
    case ::ot_real:
        return QPDFObject::create<QPDF_Real>(std::get<QPDF_Real>(obj->value).val);
    case ::ot_string:
        return QPDFObject::create<QPDF_String>(std::get<QPDF_String>(obj->value).val);
    case ::ot_name:
        return QPDFObject::create<QPDF_Name>(std::get<QPDF_Name>(obj->value).name);
    case ::ot_array:
        {
            auto const& a = std::get<QPDF_Array>(obj->value);
            if (shallow) {
                return QPDFObject::create<QPDF_Array>(a);
            } else {
                QTC::TC("qpdf", "QPDF_Array copy", a.sp ? 0 : 1);
                if (a.sp) {
                    QPDF_Array result;
                    result.sp = std::make_unique<QPDF_Array::Sparse>();
                    result.sp->size = a.sp->size;
                    for (auto const& [idx, oh]: a.sp->elements) {
                        result.sp->elements[idx] = oh.indirect() ? oh : oh.copy();
                    }
                    return QPDFObject::create<QPDF_Array>(std::move(result));
                } else {
                    std::vector<QPDFObjectHandle> result;
                    result.reserve(a.elements.size());
                    for (auto const& element: a.elements) {
                        result.emplace_back(
                            element ? (element.indirect() ? element : element.copy()) : element);
                    }
                    return QPDFObject::create<QPDF_Array>(std::move(result), false);
                }
            }
        }
    case ::ot_dictionary:
        {
            auto const& d = std::get<QPDF_Dictionary>(obj->value);
            if (shallow) {
                return QPDFObject::create<QPDF_Dictionary>(d.items);
            } else {
                std::map<std::string, QPDFObjectHandle> new_items;
                for (auto const& [key, val]: d.items) {
                    new_items[key] = val.indirect() ? val : val.copy();
                }
                return QPDFObject::create<QPDF_Dictionary>(new_items);
            }
        }
    case ::ot_stream:
        QTC::TC("qpdf", "QPDF_Stream ERR shallow copy stream");
        throw std::runtime_error("stream objects cannot be cloned");
        return {}; // does not return
    case ::ot_operator:
        return QPDFObject::create<QPDF_Operator>(std::get<QPDF_Operator>(obj->value).val);
    case ::ot_inlineimage:
        return QPDFObject::create<QPDF_InlineImage>(std::get<QPDF_InlineImage>(obj->value).val);
    case ::ot_unresolved:
        throw std::logic_error("QPDFObjectHandle: attempting to unparse a reserved object");
        return {}; // does not return
    case ::ot_destroyed:
        throw std::logic_error("attempted to shallow copy QPDFObjectHandle from destroyed QPDF");
        return {}; // does not return
    case ::ot_reference:
        return obj->qpdf->getObject(obj->og).getObj();
    }
    return {}; // unreachable
}